

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O1

void add_slay(artifact *art)

{
  _Bool _Var1;
  uint32_t uVar2;
  slay_conflict *psVar3;
  int iVar4;
  wchar_t pick;
  bool bVar5;
  
  do {
    iVar4 = 199;
    psVar3 = (slay_conflict *)0x0;
    do {
      uVar2 = Rand_div(z_info->slay_max - 1);
      pick = uVar2 + L'\x01';
      _Var1 = append_slay(&art->slays,pick);
      if (_Var1) {
        psVar3 = slays + pick;
        file_putf(log_file,"Adding slay: %sx%d\n",slays[pick].name,
                  (ulong)(uint)slays[pick].multiplier);
      }
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (!_Var1 && bVar5);
    if (psVar3 == (slay_conflict *)0x0) {
      return;
    }
    uVar2 = Rand_div(4);
    if (uVar2 == 0) {
      return;
    }
  } while (psVar3->power < 0x69);
  return;
}

Assistant:

static void add_slay(struct artifact *art)
{
	int count;
	struct slay *slay = NULL;

	for (count = 0; count < MAX_TRIES; count++) {
		int pick = randint1(z_info->slay_max - 1);

		if (!append_slay(&art->slays, pick)) continue;
		slay = &slays[pick];
		file_putf(log_file, "Adding slay: %sx%d\n", slay->name,
				  slay->multiplier);
		break;
	}

	/* Frequently add more slays if the first choice is weak */
	if (slay && randint0(4) && (slay->power < 105)) {
		add_slay(art);
	}
}